

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_template.c
# Opt level: O2

int template_match(t_template *x1,t_template *x2)

{
  int *piVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  long lVar5;
  long lVar6;
  ulong uVar7;
  
  uVar2 = x2->t_n;
  if (x1->t_n < (int)uVar2) {
    return 0;
  }
  lVar5 = ((long)x1->t_n - (long)(int)uVar2) + 1;
  lVar6 = (long)(int)uVar2 * 0x18;
  do {
    lVar5 = lVar5 + -1;
    if (lVar5 == 0) {
      uVar4 = (ulong)uVar2;
      if ((int)uVar2 < 1) {
        uVar4 = 0;
      }
      uVar7 = 0;
      do {
        if (uVar4 * 0x18 + 0x18 == uVar7 + 0x18) {
          return 1;
        }
        iVar3 = dataslot_matches((t_dataslot *)((long)&x1->t_vec->ds_type + uVar7),
                                 (t_dataslot *)((long)&x2->t_vec->ds_type + uVar7),1);
        uVar7 = uVar7 + 0x18;
      } while (iVar3 != 0);
      return 0;
    }
    piVar1 = (int *)((long)&x1->t_vec->ds_type + lVar6);
    lVar6 = lVar6 + 0x18;
  } while (*piVar1 != 3);
  return 0;
}

Assistant:

int template_match(t_template *x1, t_template *x2)
{
    int i;
    if (x1->t_n < x2->t_n)
        return (0);
    for (i = x2->t_n; i < x1->t_n; i++)
    {
        if (x1->t_vec[i].ds_type == DT_ARRAY)
                return (0);
    }
    if (x2->t_n > x1->t_n)
        post("add elements...");
    for (i = 0; i < x2->t_n; i++)
        if (!dataslot_matches(&x1->t_vec[i], &x2->t_vec[i], 1))
            return (0);
    return (1);
}